

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_luv.c
# Opt level: O0

int uv_decode(double *up,double *vp,int c)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int vi;
  int ui;
  int lower;
  int upper;
  int c_local;
  double *vp_local;
  double *up_local;
  
  if ((c < 0) || (0x3fa0 < c)) {
    up_local._4_4_ = -1;
  }
  else {
    vi = 0;
    ui = 0xa3;
    iVar1 = vi;
    do {
      vi = iVar1;
      iVar2 = vi;
      if (ui - vi < 2) break;
      iVar2 = vi + ui >> 1;
      iVar3 = c - uv_row[iVar2].ncum;
      iVar1 = iVar2;
    } while ((0 < iVar3) || (iVar1 = vi, ui = iVar2, iVar3 < 0));
    vi = iVar2;
    *up = ((double)(c - uv_row[vi].ncum) + 0.5) * 0.0035000001080334187 + (double)uv_row[vi].ustart;
    *vp = ((double)vi + 0.5) * 0.0035000001080334187 + 0.016939999535679817;
    up_local._4_4_ = 0;
  }
  return up_local._4_4_;
}

Assistant:

int
    uv_decode(double *up, double *vp, int c) /* decode (u',v') index */
{
    int upper, lower;
    register int ui, vi;

    if (c < 0 || c >= UV_NDIVS)
        return (-1);
    lower = 0; /* binary search */
    upper = UV_NVS;
    while (upper - lower > 1)
    {
        vi = (lower + upper) >> 1;
        ui = c - uv_row[vi].ncum;
        if (ui > 0)
            lower = vi;
        else if (ui < 0)
            upper = vi;
        else
        {
            lower = vi;
            break;
        }
    }
    vi = lower;
    ui = c - uv_row[vi].ncum;
    *up = uv_row[vi].ustart + (ui + .5) * UV_SQSIZ;
    *vp = UV_VSTART + (vi + .5) * UV_SQSIZ;
    return (0);
}